

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O0

void extend(section *s,int add)

{
  void *pvVar1;
  int in_ESI;
  long in_RDI;
  
  while (*(int *)(in_RDI + 0x1c) <= *(int *)(in_RDI + 0x18) + in_ESI) {
    if (*(int *)(in_RDI + 0x1c) == 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 0x100;
    }
    else {
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) << 1;
    }
    pvVar1 = realloc(*(void **)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0x1c));
    *(void **)(in_RDI + 0x10) = pvVar1;
  }
  return;
}

Assistant:

void extend(struct section *s, int add) {
	while (s->pos + add >= s->maxpos) {
		if (!s->maxpos)
			s->maxpos = 256;
		else
			s->maxpos *= 2;
		s->code = realloc (s->code, s->maxpos);
	}
}